

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  uint uVar1;
  int iVar2;
  uint in_ESI;
  int *in_RDI;
  uint32_t key;
  int i;
  uint32_t xhigh;
  uint64_t size;
  container_t *in_stack_ffffffffffffffc8;
  int local_28;
  container_t *local_20;
  
  local_20 = (container_t *)0x0;
  local_28 = 0;
  while( true ) {
    if (*in_RDI <= local_28) {
      return (uint64_t)local_20;
    }
    uVar1 = (uint)*(ushort *)(*(long *)(in_RDI + 4) + (long)local_28 * 2);
    if (in_ESI >> 0x10 <= uVar1) break;
    iVar2 = container_get_cardinality(in_stack_ffffffffffffffc8,'\0');
    local_20 = (container_t *)((long)iVar2 + (long)local_20);
    local_28 = local_28 + 1;
  }
  if (in_ESI >> 0x10 == uVar1) {
    iVar2 = container_rank(local_20,'\0',0);
    return (long)local_20 + (long)iVar2;
  }
  return (uint64_t)local_20;
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}